

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O2

void __thiscall MipsGenerator::TranslateADD(MipsGenerator *this,Pcode *item)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  MipsGenerator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string num3;
  string num2;
  string num1;
  undefined1 local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_c0,(string *)&item->m_num1);
  std::__cxx11::string::string((string *)&local_e0,(string *)&item->m_num2);
  std::__cxx11::string::string((string *)&local_100,(string *)&item->m_num3);
  this_00 = (MipsGenerator *)local_180;
  std::__cxx11::string::string((string *)this_00,"$25",(allocator *)(local_180 + 0x20));
  iVar1 = PrepareStoreREG(this_00,&local_c0,&reg1_abi_cxx11_,(string *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::string((string *)local_180,"$26",(allocator *)(local_180 + 0x20));
  uVar2 = PrepareLoadREG(this,&local_e0,&reg2_abi_cxx11_,(string *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::string((string *)local_180,"$27",(allocator *)(local_180 + 0x20));
  uVar3 = PrepareLoadREG(this,&local_100,&reg3_abi_cxx11_,(string *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  if ((uVar3 & uVar2) == 0xffffffff) {
    iVar4 = atoi(local_e0._M_dataplus._M_p);
    iVar5 = atoi(local_100._M_dataplus._M_p);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_180 + 0x20),"li ",&reg1_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_180 + 0x20)," ");
    std::__cxx11::to_string(&local_140,iVar5 + iVar4);
    std::operator+(&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   &local_140);
    Output2File(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)local_180);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_180 + 0x20)
    ;
  }
  else {
    if (uVar2 == 0xffffffff) {
      std::operator+(&local_120,"addiu ",&reg1_abi_cxx11_);
      std::operator+(&local_140,&local_120," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_180 + 0x20),&local_140,&reg3_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_180 + 0x20)," ");
      std::operator+(&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &local_e0);
      pbVar6 = &local_60;
    }
    else if (uVar3 == 0xffffffff) {
      std::operator+(&local_120,"addiu ",&reg1_abi_cxx11_);
      std::operator+(&local_140,&local_120," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_180 + 0x20),&local_140,&reg2_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_180 + 0x20)," ");
      std::operator+(&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &local_100);
      pbVar6 = &local_80;
    }
    else {
      std::operator+(&local_120,"addu ",&reg1_abi_cxx11_);
      std::operator+(&local_140,&local_120," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_180 + 0x20),&local_140,&reg2_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_180 + 0x20)," ");
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &reg3_abi_cxx11_);
      pbVar6 = &local_a0;
    }
    Output2File(this,pbVar6);
    std::__cxx11::string::~string((string *)pbVar6);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)(local_180 + 0x20));
    std::__cxx11::string::~string((string *)&local_140);
    pbVar6 = &local_120;
  }
  std::__cxx11::string::~string((string *)pbVar6);
  if (iVar1 == 1) {
    std::__cxx11::string::string((string *)local_180,"",(allocator *)&local_140);
    std::__cxx11::string::string((string *)(local_180 + 0x20),"t",(allocator *)&local_120);
    GenerateStore(this,&reg1_abi_cxx11_,&local_c0,(string *)local_180,(string *)(local_180 + 0x20));
    std::__cxx11::string::~string((string *)(local_180 + 0x20));
    std::__cxx11::string::~string((string *)local_180);
  }
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void MipsGenerator::TranslateADD(Pcode& item) {
    string num1 = item.GetNum1();
    string num2 = item.GetNum2();
    string num3 = item.GetNum3();
    int ret1 = PrepareStoreREG(num1, reg1, NUM1);
    int ret2 = PrepareLoadREG(num2, reg2, NUM2);
    int ret3 = PrepareLoadREG(num3, reg3, NUM3);
    if (ret2 == -1 && ret3 == -1) {
        int value = atoi(num2.c_str()) + atoi(num3.c_str());
        Output2File("li " + reg1 + " " + std::to_string(value));
    } else if (ret2 == -1) {
        Output2File("addiu " + reg1 + " " + reg3 + " " + num2);
    } else if (ret3 == -1) {
        Output2File("addiu " + reg1 + " " + reg2 + " " + num3);
    } else {
        Output2File("addu " + reg1 + " " + reg2 + " " + reg3);
    }
    if (ret1 == 1) {
        GenerateStore(reg1, num1, "", TMP);
    }
}